

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

int build_bl_tree(deflate_state *s)

{
  int local_14;
  int max_blindex;
  deflate_state *s_local;
  
  scan_tree(s,s->dyn_ltree,(s->l_desc).max_code);
  scan_tree(s,s->dyn_dtree,(s->d_desc).max_code);
  build_tree(s,&s->bl_desc);
  local_14 = 0x12;
  while ((2 < local_14 && (s->bl_tree["\x10\x11\x12"[local_14]].dl.dad == 0))) {
    local_14 = local_14 + -1;
  }
  s->opt_len = ((long)local_14 + 1) * 3 + 0xe + s->opt_len;
  return local_14;
}

Assistant:

local int build_bl_tree(deflate_state *s) {
    int max_blindex;  /* index of last bit length code of non zero freq */

    /* Determine the bit length frequencies for literal and distance trees */
    scan_tree(s, (ct_data *)s->dyn_ltree, s->l_desc.max_code);
    scan_tree(s, (ct_data *)s->dyn_dtree, s->d_desc.max_code);

    /* Build the bit length tree: */
    build_tree(s, (tree_desc *)(&(s->bl_desc)));
    /* opt_len now includes the length of the tree representations, except the
     * lengths of the bit lengths codes and the 5 + 5 + 4 bits for the counts.
     */

    /* Determine the number of bit length codes to send. The pkzip format
     * requires that at least 4 bit length codes be sent. (appnote.txt says
     * 3 but the actual value used is 4.)
     */
    for (max_blindex = BL_CODES-1; max_blindex >= 3; max_blindex--) {
        if (s->bl_tree[bl_order[max_blindex]].Len != 0) break;
    }
    /* Update opt_len to include the bit length tree and counts */
    s->opt_len += 3*((ulg)max_blindex + 1) + 5 + 5 + 4;
    Tracev((stderr, "\ndyn trees: dyn %ld, stat %ld",
            s->opt_len, s->static_len));

    return max_blindex;
}